

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

TPZVec<double> * __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::IntegrateSolution
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,int var)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  TPZFMatrix<double> *pTVar4;
  ostream *poVar5;
  TPZMaterialDataT<double> *pTVar6;
  TPZCompElSide *this_00;
  TPZCompEl *pTVar7;
  int64_t iVar8;
  int *piVar9;
  TPZGeoEl *pTVar10;
  TPZIntPoints *pTVar11;
  uint in_EDX;
  TPZVec<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  int iv;
  int int_ind;
  REAL detJac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZFMatrix<double> jac;
  TPZManVector<double,_10> solout;
  int nvar;
  int intrulepoints;
  TPZManVector<int,_3> intorder;
  TPZGeoEl *ref;
  int order;
  int svec;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZManVector<int,_3> ordervec;
  REAL weight;
  TPZManVector<double,_3> intpointtemp;
  TPZManVector<double,_3> intpoint;
  TPZAutoPointer<TPZIntPoints> intrule;
  int dim;
  TPZManVector<TPZTransform<double>,_10> trvec;
  int64_t nref;
  TPZManVector<TPZMaterialDataT<double>,_3> datavec;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *thisnonconst;
  TPZMatCombinedSpacesT<double> *matCombined;
  TPZMaterial *material;
  TPZManVector<double,_10> result;
  int64_t in_stack_fffffffffffe63a8;
  _func_int **pp_Var12;
  TPZManVector<double,_10> *in_stack_fffffffffffe63b0;
  TPZCompEl *in_stack_fffffffffffe63b8;
  TPZManVector<TPZMaterialDataT<double>,_3> *in_stack_fffffffffffe63c0;
  undefined4 in_stack_fffffffffffe63c8;
  undefined4 in_stack_fffffffffffe63cc;
  uint uVar13;
  TPZManVector<double,_10> *in_stack_fffffffffffe63d0;
  undefined4 in_stack_fffffffffffe63d8;
  undefined4 in_stack_fffffffffffe63dc;
  TPZFMatrix<double> *in_stack_fffffffffffe63e0;
  int64_t in_stack_fffffffffffe63e8;
  undefined4 in_stack_fffffffffffe6448;
  undefined4 in_stack_fffffffffffe644c;
  TPZManVector<TPZMaterialDataT<double>,_3> *in_stack_fffffffffffe6450;
  long *plStack_19ba0;
  TPZFMatrix<double> *jacinv;
  TPZGeoEl *detjac;
  TPZFMatrix<double> *jac_00;
  TPZVec<double> *qsi;
  TPZGeoEl *this_01;
  int iStack_19b28;
  uint uStack_19b24;
  double dStack_19b20;
  TPZVec<double> aTStack_19960 [3];
  int iStack_198f0;
  int iStack_198ec;
  undefined1 auStack_198e8 [48];
  TPZGeoEl *pTStack_198b8;
  int iStack_198b0;
  int iStack_198ac;
  long *plStack_198a8;
  int64_t iStack_198a0;
  TPZVec<int> TStack_19898;
  TPZCompEl *pTStack_19868;
  undefined8 uStack_19860;
  undefined1 auStack_19858 [32];
  size_t in_stack_fffffffffffe67c8;
  char *in_stack_fffffffffffe67d0;
  TPZAutoPointer<TPZIntPoints> TStack_197e0;
  int iStack_197d4;
  undefined1 auStack_197d0 [4192];
  long lStack_18770;
  TPZVec<TPZMaterialDataT<double>_> aTStack_18768 [3127];
  TPZVec<double> local_88 [3];
  uint local_14;
  TPZGeoEl *pTVar3;
  
  jac_00 = in_RDI;
  local_14 = in_EDX;
  TPZManVector<double,_10>::TPZManVector
            (in_stack_fffffffffffe63d0,CONCAT44(in_stack_fffffffffffe63cc,in_stack_fffffffffffe63c8)
            );
  iVar1 = (*in_RSI->_vptr_TPZVec[0x17])();
  pTVar3 = (TPZGeoEl *)CONCAT44(extraout_var,iVar1);
  if ((pTVar3 == (TPZGeoEl *)0x0) ||
     (detjac = pTVar3, this_01 = pTVar3,
     pTVar4 = (TPZFMatrix<double> *)
              __dynamic_cast(pTVar3,&TPZMaterial::typeinfo,&TPZMatCombinedSpacesT<double>::typeinfo,
                             0xfffffffffffffffe), pTVar4 == (TPZFMatrix<double> *)0x0)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar5 = std::operator<<(poVar5,
                             "virtual TPZVec<STATE> TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::IntegrateSolution(int) const [TGeometry = pzgeom::TPZGeoTetrahedra]"
                            );
    std::operator<<(poVar5," this->Material() == NULL\n");
    TPZVec<double>::TPZVec
              ((TPZVec<double> *)in_stack_fffffffffffe63c0,
               (TPZVec<double> *)in_stack_fffffffffffe63b8);
  }
  else {
    jacinv = pTVar4;
    iVar1 = (*in_RSI->_vptr_TPZVec[0x12])();
    if (iVar1 == 0) {
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffe63c0,
                 (TPZVec<double> *)in_stack_fffffffffffe63b8);
    }
    else {
      qsi = in_RSI;
      TPZManVector<TPZMaterialDataT<double>,_3>::TPZManVector
                (in_stack_fffffffffffe6450,
                 CONCAT44(in_stack_fffffffffffe644c,in_stack_fffffffffffe6448));
      lStack_18770 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)&qsi[3].fNAlloc);
      TPZVec<TPZMaterialDataT<double>_>::resize
                ((TPZVec<TPZMaterialDataT<double>_> *)in_stack_fffffffffffe63b0,
                 in_stack_fffffffffffe63a8);
      (*in_RSI->_vptr_TPZVec[0x51])(in_RSI,aTStack_18768,0);
      TPZManVector<TPZTransform<double>,_10>::TPZManVector
                ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffe6450,
                 CONCAT44(in_stack_fffffffffffe644c,in_stack_fffffffffffe6448));
      (*qsi->_vptr_TPZVec[0x50])(qsi,auStack_197d0);
      iStack_197d4 = (*qsi->_vptr_TPZVec[0x16])();
      TPZAutoPointer<TPZIntPoints>::TPZAutoPointer
                ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffe63c0);
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_fffffffffffe63e0,
                 CONCAT44(in_stack_fffffffffffe63dc,in_stack_fffffffffffe63d8),
                 (double *)in_stack_fffffffffffe63d0);
      uStack_19860 = 0;
      TPZManVector<double,_3>::TPZManVector
                ((TPZManVector<double,_3> *)in_stack_fffffffffffe63e0,
                 CONCAT44(in_stack_fffffffffffe63dc,in_stack_fffffffffffe63d8),
                 (double *)in_stack_fffffffffffe63d0);
      pTStack_19868 = (TPZCompEl *)0x0;
      TPZManVector<int,_3>::TPZManVector
                ((TPZManVector<int,_3> *)in_stack_fffffffffffe63d0,
                 CONCAT44(in_stack_fffffffffffe63cc,in_stack_fffffffffffe63c8));
      for (iStack_198a0 = 0; iStack_198a0 < lStack_18770; iStack_198a0 = iStack_198a0 + 1) {
        pTVar6 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_18768,iStack_198a0);
        (pTVar6->super_TPZMaterialData).fNeedsSol = true;
        this_00 = TPZVec<TPZCompElSide>::operator[]
                            ((TPZVec<TPZCompElSide> *)&qsi[3].fNAlloc,iStack_198a0);
        pTVar7 = TPZCompElSide::Element(this_00);
        if (pTVar7 == (TPZCompEl *)0x0) {
          plStack_19ba0 = (long *)0x0;
        }
        else {
          plStack_19ba0 =
               (long *)__dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0
                                     );
        }
        plStack_198a8 = plStack_19ba0;
        if (plStack_19ba0 != (long *)0x0) {
          TPZVec<int>::size(&TStack_19898);
          TPZManVector<int,_3>::Resize
                    ((TPZManVector<int,_3> *)in_stack_fffffffffffe63e0,
                     CONCAT44(in_stack_fffffffffffe63dc,in_stack_fffffffffffe63d8));
          iVar8 = TPZVec<int>::size(&TStack_19898);
          iStack_198ac = (int)iVar8;
          iVar1 = (**(code **)(*plStack_198a8 + 0x268))();
          pTVar6 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_18768,iStack_198a0);
          (pTVar6->super_TPZMaterialData).p = iVar1;
          pTVar6 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_18768,iStack_198a0);
          iVar1 = (pTVar6->super_TPZMaterialData).p;
          piVar9 = TPZVec<int>::operator[](&TStack_19898,(long)(iStack_198ac + -1));
          *piVar9 = iVar1;
        }
      }
      iStack_198b0 = (*(pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                       _vptr_TPZSavable[9])(pTVar4,&TStack_19898);
      pTVar10 = TPZCompEl::Reference(in_stack_fffffffffffe63b8);
      pTStack_198b8 = pTVar10;
      iVar1 = (**(code **)(*(long *)pTVar10 + 0xf0))();
      (**(code **)(*(long *)pTVar10 + 0x70))(pTVar10,iVar1 + -1,iStack_198b0);
      TPZAutoPointer<TPZIntPoints>::operator=
                ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffe63d0,
                 (TPZIntPoints *)CONCAT44(in_stack_fffffffffffe63cc,in_stack_fffffffffffe63c8));
      TPZManVector<int,_3>::TPZManVector
                ((TPZManVector<int,_3> *)in_stack_fffffffffffe63e0,
                 CONCAT44(in_stack_fffffffffffe63dc,in_stack_fffffffffffe63d8),
                 (int *)in_stack_fffffffffffe63d0);
      pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_197e0);
      (*pTVar11->_vptr_TPZIntPoints[5])(pTVar11,auStack_198e8,0);
      pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_197e0);
      iVar1 = (*pTVar11->_vptr_TPZIntPoints[3])();
      iStack_198ec = iVar1;
      if (1000 < iVar1) {
        pzinternal::DebugStopImpl(in_stack_fffffffffffe67d0,in_stack_fffffffffffe67c8);
      }
      iVar2 = (**(code **)((long)*(REAL *)pTVar3 + 0x88))(pTVar3,local_14);
      iStack_198f0 = iVar2;
      TPZManVector<double,_10>::TPZManVector
                (in_stack_fffffffffffe63d0,
                 CONCAT44(in_stack_fffffffffffe63cc,in_stack_fffffffffffe63c8));
      TPZManVector<double,_10>::Resize
                ((TPZManVector<double,_10> *)CONCAT44(iVar1,iVar2),in_stack_fffffffffffe63e8,
                 (double *)in_stack_fffffffffffe63e0);
      TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffe63e0);
      TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffe63e0);
      TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffe63e0);
      for (uStack_19b24 = 0; (int)uStack_19b24 < iStack_198ec; uStack_19b24 = uStack_19b24 + 1) {
        pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_197e0);
        (*pTVar11->_vptr_TPZIntPoints[4])(pTVar11,(ulong)uStack_19b24,auStack_19858,&pTStack_19868);
        TPZGeoEl::Jacobian(this_01,qsi,jac_00,in_RDI,(REAL *)detjac,jacinv);
        pTStack_19868 = (TPZCompEl *)((double)pTStack_19868 * ABS(dStack_19b20));
        uVar13 = uStack_19b24;
        pTVar6 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_18768,0);
        (pTVar6->super_TPZMaterialData).intLocPtIndex = uVar13;
        uVar13 = uStack_19b24;
        pTVar6 = TPZVec<TPZMaterialDataT<double>_>::operator[](aTStack_18768,1);
        (pTVar6->super_TPZMaterialData).intLocPtIndex = uVar13;
        (*in_RSI->_vptr_TPZVec[0x55])(in_RSI,auStack_19858,auStack_197d0,aTStack_18768);
        (*(pTVar4->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x11])(pTVar4,aTStack_18768,(ulong)local_14,aTStack_19960);
        for (iStack_19b28 = 0; iStack_19b28 < iStack_198f0; iStack_19b28 = iStack_19b28 + 1) {
          in_stack_fffffffffffe63b8 = pTStack_19868;
          in_stack_fffffffffffe63c0 =
               (TPZManVector<TPZMaterialDataT<double>,_3> *)
               TPZVec<double>::operator[](aTStack_19960,(long)iStack_19b28);
          pp_Var12 = (in_stack_fffffffffffe63c0->super_TPZVec<TPZMaterialDataT<double>_>).
                     _vptr_TPZVec;
          in_stack_fffffffffffe63b0 =
               (TPZManVector<double,_10> *)TPZVec<double>::operator[](local_88,(long)iStack_19b28);
          (in_stack_fffffffffffe63b0->super_TPZVec<double>)._vptr_TPZVec =
               (_func_int **)
               ((double)in_stack_fffffffffffe63b8 * (double)pp_Var12 +
               (double)(in_stack_fffffffffffe63b0->super_TPZVec<double>)._vptr_TPZVec);
        }
      }
      TPZVec<double>::TPZVec
                ((TPZVec<double> *)in_stack_fffffffffffe63c0,
                 (TPZVec<double> *)in_stack_fffffffffffe63b8);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b8579a);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b857a7);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b857b4);
      TPZManVector<double,_10>::~TPZManVector(in_stack_fffffffffffe63b0);
      TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffe63b0);
      TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffe63b0);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffe63b0);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffe63b0);
      TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer
                ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffe63b0);
      TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffe63c0);
      TPZManVector<TPZMaterialDataT<double>,_3>::~TPZManVector(in_stack_fffffffffffe63c0);
    }
  }
  TPZManVector<double,_10>::~TPZManVector(in_stack_fffffffffffe63b0);
  return (TPZVec<double> *)jac_00;
}

Assistant:

TPZVec<STATE> TPZMultiphysicsCompEl<TGeometry>::IntegrateSolution(int var) const
{
    TPZManVector<STATE> result;
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<STATE>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return result;
    }
    
    if (this->NConnects() == 0) return result;//boundary discontinuous elements have this characteristic
    
    TPZMultiphysicsCompEl<TGeometry> *thisnonconst = (TPZMultiphysicsCompEl<TGeometry> *) this;
    
    TPZManVector<TPZMaterialDataT<STATE>,3> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    thisnonconst->InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,3> intpoint(dim,0.), intpointtemp(dim,0.);
    REAL weight = 0.;
    
    TPZManVector<int,3> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        datavec[iref].fNeedsSol = true;
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,3> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    int nvar = material->NSolutionVariables(var);
    TPZManVector<STATE> solout(var);
    result.Resize(nvar, 0.);
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        datavec[0].intLocPtIndex = int_ind;
        datavec[1].intLocPtIndex = int_ind;
        
        
        thisnonconst->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Solution(datavec, var, solout);
        
        for (int iv=0; iv<nvar; iv++) {
            result[iv] += weight*solout[iv];
        }
        
    }//loop over integratin points
    
    return result;
}